

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_get_signature_hash
              (wally_tx *tx,size_t index,uchar *script,size_t script_len,uchar *extra,
              size_t extra_len,uint32_t extra_offset,uint64_t satoshi,uchar *value,size_t value_len,
              uint32_t sighash,uint32_t tx_sighash,uint32_t flags,uchar *bytes_out,size_t len)

{
  wally_tx *tx_00;
  _Bool _Var1;
  int iVar2;
  uchar *bytes_out_00;
  uint uVar3;
  uchar buff [2048];
  ulong local_8a0;
  wally_tx *local_898;
  size_t local_890;
  ulong local_888;
  size_t local_880;
  tx_serialize_opts local_878;
  uchar local_838 [2056];
  
  local_890 = 0;
  local_878.sighash = sighash;
  local_878.tx_sighash = tx_sighash;
  local_878.satoshi = satoshi;
  uVar3 = flags & 1;
  local_878.bip143 = SUB41(uVar3,0);
  local_878.value = value;
  local_878.value_len = value_len;
  local_898 = tx;
  local_888 = index;
  local_878.index = index;
  local_878.script = script;
  local_878.script_len = script_len;
  _Var1 = is_valid_tx(tx);
  tx_00 = local_898;
  if (!_Var1) {
    return -2;
  }
  if ((script != (uchar *)0x0) == (script_len == 0)) {
    return -2;
  }
  if ((0xff < sighash || (extra_len != 0) != (extra != (uchar *)0x0)) || 2100000000000000 < satoshi)
  {
    return -2;
  }
  if (len < 0x20 || (bytes_out == (uchar *)0x0 || 0xf < flags)) {
    return -2;
  }
  if (extra != (uchar *)0x0) {
    return -1;
  }
  if (extra_len != 0) {
    return -1;
  }
  if (extra_offset != 0) {
    return -1;
  }
  if (local_888 < local_898->num_inputs) {
    if (((uVar3 == 0) && ((sighash & 0x1f) == 3)) && (local_898->num_outputs <= local_888)) {
LAB_003ffc63:
      bytes_out[0] = '\0';
      bytes_out[1] = '\0';
      bytes_out[2] = '\0';
      bytes_out[3] = '\0';
      bytes_out[4] = '\0';
      bytes_out[5] = '\0';
      bytes_out[6] = '\0';
      bytes_out[7] = '\0';
      bytes_out[8] = '\0';
      bytes_out[9] = '\0';
      bytes_out[10] = '\0';
      bytes_out[0xb] = '\0';
      bytes_out[0xc] = '\0';
      bytes_out[0xd] = '\0';
      bytes_out[0xe] = '\0';
      bytes_out[0xf] = '\0';
      bytes_out[0x10] = '\0';
      bytes_out[0x11] = '\0';
      bytes_out[0x12] = '\0';
      bytes_out[0x13] = '\0';
      bytes_out[0x14] = '\0';
      bytes_out[0x15] = '\0';
      bytes_out[0x16] = '\0';
      bytes_out[0x17] = '\0';
      bytes_out[0x18] = '\0';
      bytes_out[0x19] = '\0';
      bytes_out[0x1a] = '\0';
      bytes_out[0x1b] = '\0';
      bytes_out[0x1c] = '\0';
      bytes_out[0x1d] = '\0';
      bytes_out[0x1e] = '\0';
      bytes_out[0x1f] = '\0';
      *bytes_out = '\x01';
      return 0;
    }
  }
  else if (uVar3 == 0) goto LAB_003ffc63;
  iVar2 = wally_tx_is_elements(local_898,&local_890);
  bytes_out_00 = local_838;
  if ((iVar2 == 0) &&
     (iVar2 = tx_get_length(tx_00,&local_878,0,&local_8a0,local_890 != 0), iVar2 == 0)) {
    if (local_8a0 < 0x801) {
      bytes_out_00 = local_838;
    }
    else {
      bytes_out_00 = (uchar *)wally_malloc(local_8a0);
      if (bytes_out_00 == (uchar *)0x0) {
        iVar2 = -3;
        bytes_out_00 = (uchar *)0x0;
        goto LAB_003ffcc1;
      }
    }
    iVar2 = tx_to_bytes(tx_00,&local_878,0,bytes_out_00,local_8a0,&local_880,local_890 != 0);
    if ((iVar2 == 0) && (iVar2 = -1, local_8a0 == local_880)) {
      iVar2 = wally_sha256d(bytes_out_00,local_880,bytes_out,len);
    }
  }
LAB_003ffcc1:
  if (bytes_out_00 != local_838) {
    clear_and_free(bytes_out_00,local_8a0);
    return iVar2;
  }
  wally_clear(local_838,0x800);
  return iVar2;
}

Assistant:

static int tx_get_signature_hash(const struct wally_tx *tx,
                                 size_t index,
                                 const unsigned char *script, size_t script_len,
                                 const unsigned char *extra, size_t extra_len,
                                 uint32_t extra_offset, uint64_t satoshi,
                                 const unsigned char *value,
                                 size_t value_len,
                                 uint32_t sighash, uint32_t tx_sighash, uint32_t flags,
                                 unsigned char *bytes_out, size_t len)
{
    unsigned char buff[TX_STACK_SIZE], *buff_p = buff;
    size_t n, n2;
    size_t is_elements = 0;
    int ret;
    const struct tx_serialize_opts opts = {
        sighash, tx_sighash, index, script, script_len, satoshi,
        (flags & WALLY_TX_FLAG_USE_WITNESS) ? true : false,
        value, value_len
    };

    if (!is_valid_tx(tx) || BYTES_INVALID(script, script_len) ||
        BYTES_INVALID(extra, extra_len) ||
        satoshi > WALLY_SATOSHI_MAX || (sighash & 0xffffff00) ||
        (flags & ~WALLY_TX_ALL_FLAGS) || !bytes_out || len < SHA256_LEN)
        return WALLY_EINVAL;

    if (extra || extra_len || extra_offset)
        return WALLY_ERROR; /* FIXME: Not implemented yet */

    if (index >= tx->num_inputs ||
        (index >= tx->num_outputs && (sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE)) {
        if (!(flags & WALLY_TX_FLAG_USE_WITNESS)) {
            memset(bytes_out, 0, SHA256_LEN);
            bytes_out[0] = 0x1;
            return WALLY_OK;
        }
    }

#ifdef BUILD_ELEMENTS
    if ((ret = wally_tx_is_elements(tx, &is_elements)) != WALLY_OK)
        goto fail;
#endif

    if ((ret = tx_get_length(tx, &opts, 0, &n, is_elements != 0)) != WALLY_OK)
        goto fail;

    if (n > sizeof(buff) && (buff_p = wally_malloc(n)) == NULL) {
        ret = WALLY_ENOMEM;
        goto fail;
    }

    if ((ret = tx_to_bytes(tx, &opts, 0, buff_p, n, &n2, is_elements != 0)) != WALLY_OK)
        goto fail;

    if (n != n2)
        ret = WALLY_ERROR; /* tx_get_length/tx_to_bytes mismatch, should not happen! */
    else
        ret = wally_sha256d(buff_p, n2, bytes_out, len);

fail:
    if (buff_p != buff)
        clear_and_free(buff_p, n);
    else
        wally_clear(buff, sizeof(buff));
    return ret;
}